

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::Create(Window *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  WINDOW *pWVar5;
  PANEL *pPVar6;
  bool bVar7;
  
  if (this->frame != (WINDOW *)0x0) {
    __assert_fail("this->frame == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/Window.cpp"
                  ,0x2de,"virtual void cursespp::Window::Create()");
  }
  if (this->content != (WINDOW *)0x0) {
    __assert_fail("this->content == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/Window.cpp"
                  ,0x2df,"virtual void cursespp::Window::Create()");
  }
  if (this->framePanel != (PANEL *)0x0) {
    __assert_fail("this->framePanel == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/Window.cpp"
                  ,0x2e0,"virtual void cursespp::Window::Create()");
  }
  if (this->contentPanel != (PANEL *)0x0) {
    __assert_fail("this->contentPanel == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/Window.cpp"
                  ,0x2e1,"virtual void cursespp::Window::Create()");
  }
  if ((this->parent != (IWindow *)0x0) &&
     (iVar2 = (*(this->parent->super_IOrderable)._vptr_IOrderable[0x23])(), (char)iVar2 == '\0')) {
    return;
  }
  bVar7 = this->badBounds;
  bVar1 = CheckForBoundsError(this);
  this->badBounds = bVar1;
  if (!bVar1) {
    if (this->parent == (IWindow *)0x0) {
      iVar3 = 0;
      iVar2 = 0;
    }
    else {
      iVar2 = (*(this->parent->super_IOrderable)._vptr_IOrderable[0x1c])();
      iVar3 = (*(this->parent->super_IOrderable)._vptr_IOrderable[0x1d])();
      iVar4 = (*(this->parent->super_IOrderable)._vptr_IOrderable[0x12])();
      if ((char)iVar4 != '\0') {
        iVar2 = iVar2 + 1;
        iVar3 = iVar3 + 1;
      }
    }
    pWVar5 = (WINDOW *)newwin(this->height,this->width,this->y + iVar3,this->x + iVar2);
    this->frame = pWVar5;
    if (pWVar5 == (WINDOW *)0x0) {
      return;
    }
    (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x24])(this);
    pPVar6 = (PANEL *)new_panel(this->frame);
    this->framePanel = pPVar6;
    if (this->drawFrame == false) {
      this->content = this->frame;
      RepaintBackground(this);
    }
    else {
      pWVar5 = (WINDOW *)
               newwin(this->height + -2,this->width + -2,iVar3 + this->y + 1,iVar2 + this->x + 1);
      this->content = pWVar5;
      if (pWVar5 == (WINDOW *)0x0) goto LAB_001992a9;
      pPVar6 = (PANEL *)new_panel(pWVar5);
      this->contentPanel = pPVar6;
      RepaintBackground(this);
      DrawFrameAndTitle(this);
    }
    (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x2b])(this);
    if (bVar7 == false) {
      if (this->badBounds != true) {
        return;
      }
      bVar7 = false;
    }
    else {
      if (this->isVisibleInParent != true) {
        return;
      }
      bVar7 = true;
    }
    NotifyVisibilityChange(this,bVar7);
    return;
  }
LAB_001992a9:
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x30])(this);
  return;
}

Assistant:

void Window::Create() {
    ASSERT_MAIN_THREAD();

    assert(this->frame == nullptr);
    assert(this->content == nullptr);
    assert(this->framePanel == nullptr);
    assert(this->contentPanel == nullptr);

    if (this->parent && !this->parent->IsVisible()) {
        return;
    }

    bool hadBadBounds = this->badBounds;
    this->badBounds = this->CheckForBoundsError();

    if (this->badBounds) {
        this->Destroy();
        return;
    }

    /* else we have valid bounds. this->x and this->y are specified in
    relative space; find their absolute offset based on our parent. */

    int absoluteXOffset = 0;
    int absoluteYOffset = 0;

    if (this->parent) {
        absoluteXOffset = this->parent->GetAbsoluteX();
        absoluteYOffset = this->parent->GetAbsoluteY();

        if (parent->IsFrameVisible()) {
            absoluteXOffset += 1;
            absoluteYOffset += 1;
        }
    }

    this->frame = newwin(
        this->height,
        this->width,
        absoluteYOffset + this->y,
        absoluteXOffset + this->x);

    if (this->frame) { /* can fail if the screen size is too small. */
        /* resolve our current colors colors */

        bool focused = this->IsFocused();

        int64_t currentFrameColor = focused
            ? this->focusedFrameColor : this->frameColor;

        int64_t currentContentColor = focused
            ? this->focusedContentColor : this->contentColor;

        /* create the corresponding panel. required for z-ordering. */

        this->framePanel = new_panel(this->frame);

        /* if we were asked not to draw a frame, we'll set the frame equal to
        the content view, and use the content views colors*/

        if (!this->drawFrame) {
            this->content = this->frame;
            this->RepaintBackground();
        }

        /* otherwise we'll draw a box around the frame, and create a content
        sub-window inside */

        else {
            this->content = newwin(
                this->height - 2,
                this->width - 2,
                absoluteYOffset + this->y + 1,
                absoluteXOffset + this->x + 1);

            if (!this->content) {
                /* should never happen. if there's enough room for this->frame,
                there's enough room for this->content */
                this->Destroy();
                return;
            }

            this->contentPanel = new_panel(this->content);
            this->RepaintBackground();
            this->DrawFrameAndTitle();
        }

        this->Show();

        if (hadBadBounds && this->isVisibleInParent) {
            this->NotifyVisibilityChange(true);
        }
        else if (!hadBadBounds && this->badBounds) {
            this->NotifyVisibilityChange(false);
        }
    }
}